

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.c
# Opt level: O2

uint32_t hash_camera(scene_node *node)

{
  uint32_t uVar1;
  
  uVar1 = hash_uint32(0x811c9dc5,(uint32_t)node);
  uVar1 = hash_uint32(uVar1,(uint32_t)((ulong)node >> 0x20));
  return uVar1;
}

Assistant:

static uint32_t hash_camera(const struct scene_node* node) {
    return hash_ptr(hash_init(), node);
}